

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O1

void __thiscall
ByteCodeGenerator::EmitTopLevelStatement
          (ByteCodeGenerator *this,ParseNode *stmt,FuncInfo *funcInfo,BOOL fReturnValue)

{
  bool bVar1;
  ParseNodeFnc *pPVar2;
  
  if ((stmt->nop == knopFncDecl) &&
     (pPVar2 = ParseNode::AsParseNodeFnc(stmt),
     (pPVar2->fncFlags & kFunctionDeclaration) != kFunctionNone)) {
    return;
  }
  if ((stmt->nop == knopDot) || (stmt->nop == knopName)) {
    StartStatement(this,stmt);
    Js::ByteCodeWriter::Empty(&this->m_writer,Nop);
    Js::ByteCodeWriter::EndStatement(&this->m_writer,stmt);
  }
  Emit(stmt,this,funcInfo,fReturnValue,false,true);
  bVar1 = FuncInfo::IsTmpReg(funcInfo,stmt->location);
  if (!bVar1) {
    return;
  }
  FuncInfo::ReleaseLoc(funcInfo,stmt);
  return;
}

Assistant:

void ByteCodeGenerator::EmitTopLevelStatement(ParseNode *stmt, FuncInfo *funcInfo, BOOL fReturnValue)
{
    if (stmt->nop == knopFncDecl && stmt->AsParseNodeFnc()->IsDeclaration())
    {
        // Function declarations (not function-declaration RHS's) are already fully processed.
        // Skip them here so the temp registers don't get messed up.
        return;
    }

    if (stmt->nop == knopName || stmt->nop == knopDot)
    {
        // Generating span for top level names are mostly useful in debugging mode, because user can debug it even though no side-effect expected.
        // But the name can have runtime error, e.g., foo.bar; // where foo is not defined.
        // At this time we need to throw proper line number and offset. so recording on all modes will be useful.
        StartStatement(stmt);
        Writer()->Empty(Js::OpCode::Nop);
        EndStatement(stmt);
    }

    Emit(stmt, this, funcInfo, fReturnValue, false/*isConstructorCall*/, true/*isTopLevel*/);
    if (funcInfo->IsTmpReg(stmt->location))
    {
        funcInfo->ReleaseLoc(stmt);
    }
}